

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

float __thiscall crnlib::vec<1U,_float>::squared_distance(vec<1U,_float> *this,vec<1U,_float> *rhs)

{
  bool bVar1;
  float fVar2;
  float d;
  uint i;
  float dist2;
  vec<1U,_float> *rhs_local;
  vec<1U,_float> *this_local;
  
  d = 0.0;
  bVar1 = false;
  while (!bVar1) {
    fVar2 = this->m_s[0] - rhs->m_s[0];
    d = fVar2 * fVar2 + d;
    bVar1 = true;
  }
  return d;
}

Assistant:

inline T squared_distance(const vec& rhs) const
        {
            T dist2 = 0;
            for (uint i = 0; i < N; i++)
            {
                T d = m_s[i] - rhs.m_s[i];
                dist2 += d * d;
            }
            return dist2;
        }